

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype __thiscall
QtPrivate::lastIndexOf
          (QtPrivate *this,QStringView haystack,qsizetype from,char16_t needle,CaseSensitivity cs)

{
  long lVar1;
  ushort uVar2;
  storage_type_conflict *psVar3;
  storage_type_conflict *psVar4;
  long lVar5;
  storage_type_conflict *psVar6;
  undefined6 in_register_00000082;
  short sVar7;
  ushort uVar8;
  
  uVar2 = (ushort)from;
  psVar3 = (storage_type_conflict *)haystack.m_size;
  psVar6 = haystack.m_data;
  if (psVar6 != (storage_type_conflict *)0x0) {
    if ((long)psVar3 < 0) {
      psVar4 = (storage_type_conflict *)((long)psVar3 + (long)psVar6);
      if ((long)psVar3 + (long)psVar6 < 0) {
        return -1;
      }
    }
    else {
      psVar4 = psVar3;
      if (psVar6 < psVar3) {
        psVar4 = (storage_type_conflict *)((long)psVar6 - 1);
      }
    }
    if ((int)CONCAT62(in_register_00000082,needle) == 1) {
      if (-1 < (long)psVar4) {
        lVar5 = (long)psVar4 * 2;
        do {
          if (*(ushort *)(this + lVar5) == uVar2) {
            return lVar5 >> 1;
          }
          lVar1 = lVar5 + -2;
          lVar5 = lVar5 + -2;
        } while (this <= this + lVar1);
      }
    }
    else {
      sVar7 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)(((uint)(from & 0xffffU) & 0x1f) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               ((from & 0xffffU) >> 5) * 2)) * 2) *
                                         0x14 + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)(((uint)(from & 0xffffU) & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie + ((from & 0xffffU) >> 5) * 2))
                    * 2) * 0x14 + 0xe) & 1) == 0) {
        uVar2 = sVar7 + uVar2;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar7 * 2) == 1) {
        uVar2 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar7 * 2 + 2);
      }
      if (-1 < (long)psVar4) {
        lVar5 = (long)psVar4 * 2;
        while( true ) {
          uVar8 = *(ushort *)(this + lVar5);
          sVar7 = (short)((uint)(int)(short)*(ushort *)
                                             (QUnicodeTables::uc_properties +
                                             (ulong)*(ushort *)
                                                     (QUnicodeTables::uc_property_trie +
                                                     (ulong)((uVar8 & 0x1f) +
                                                            (uint)*(ushort *)
                                                                   (QUnicodeTables::uc_property_trie
                                                                   + (ulong)(uVar8 >> 5) * 2)) * 2)
                                             * 0x14 + 0xe) >> 1);
          if ((*(ushort *)
                (QUnicodeTables::uc_properties +
                (ulong)*(ushort *)
                        (QUnicodeTables::uc_property_trie +
                        (ulong)((uVar8 & 0x1f) +
                               (uint)*(ushort *)
                                      (QUnicodeTables::uc_property_trie + (ulong)(uVar8 >> 5) * 2))
                        * 2) * 0x14 + 0xe) & 1) == 0) {
            uVar8 = sVar7 + uVar8;
          }
          else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar7 * 2) == 1) {
            uVar8 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar7 * 2 + 2);
          }
          if (uVar8 == uVar2) break;
          lVar1 = lVar5 + -2;
          lVar5 = lVar5 + -2;
          if (this + lVar1 < this) {
            return -1;
          }
        }
        return lVar5 >> 1;
      }
    }
  }
  return -1;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, char16_t needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, QChar(needle), from, cs);
}